

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::ProtoElement
          (ProtoElement *this,TypeInfo *typeinfo,Type *type,ProtoWriter *enclosing)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree<const_google::protobuf::Field_*,_const_google::protobuf::Field_*,_std::_Identity<const_google::protobuf::Field_*>,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
  local_60;
  allocator_type local_29;
  
  (this->super_BaseElement).parent_._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  .
  super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
  ._M_head_impl = (BaseElement *)0x0;
  (this->super_BaseElement).level_ = 0;
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ProtoElement_003c8f30;
  (this->super_LocationTrackerInterface)._vptr_LocationTrackerInterface =
       (_func_int **)&PTR__ProtoElement_003c8f60;
  this->ow_ = enclosing;
  this->parent_field_ = (Field *)0x0;
  this->typeinfo_ = typeinfo;
  this->proto3_ = type->syntax_ == 1;
  this->type_ = type;
  p_Var1 = &(this->required_fields_)._M_t._M_impl.super__Rb_tree_header;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->size_index_ = -1;
  this->array_index_ = -1;
  local_60._M_impl._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->oneof_indices_,
             (long)(type->oneofs_).super_RepeatedPtrFieldBase.current_size_ + 1,(bool *)&local_60,
             &local_29);
  if (this->proto3_ == false) {
    anon_unknown_8::GetRequiredFields
              ((set<const_google::protobuf::Field_*,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
                *)&local_60,this->type_);
    std::
    _Rb_tree<const_google::protobuf::Field_*,_const_google::protobuf::Field_*,_std::_Identity<const_google::protobuf::Field_*>,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
    ::clear(&(this->required_fields_)._M_t);
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var2 = &local_60._M_impl.super__Rb_tree_header;
      (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_60._M_impl.super__Rb_tree_header._M_header._M_color;
      (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
      (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_60._M_impl.super__Rb_tree_header._M_node_count;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    std::
    _Rb_tree<const_google::protobuf::Field_*,_const_google::protobuf::Field_*,_std::_Identity<const_google::protobuf::Field_*>,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

ProtoWriter::ProtoElement::ProtoElement(const TypeInfo* typeinfo,
                                        const google::protobuf::Type& type,
                                        ProtoWriter* enclosing)
    : BaseElement(nullptr),
      ow_(enclosing),
      parent_field_(nullptr),
      typeinfo_(typeinfo),
      proto3_(type.syntax() == google::protobuf::SYNTAX_PROTO3),
      type_(type),
      size_index_(-1),
      array_index_(-1),
      // oneof_indices_ values are 1-indexed (0 means not present).
      oneof_indices_(type.oneofs_size() + 1) {
  if (!proto3_) {
    required_fields_ = GetRequiredFields(type_);
  }
}